

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O2

void ELFIO::dump::dynamic_tag
               (ostream *out,Elf_Xword no,Elf_Xword tag,Elf_Xword value,string *str,uint param_6)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  string local_50 [32];
  
  poVar3 = std::operator<<(out,"[");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 5;
  poVar3 = std::operator<<(poVar3,0x20);
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"] ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0x10;
  poVar3 = std::operator<<(poVar3,0x20);
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffff4f | 0x20;
  str_dynamic_tag<unsigned_long>(value);
  poVar3 = std::operator<<(poVar3,local_50);
  std::operator<<(poVar3," ");
  std::__cxx11::string::~string(local_50);
  if (str->_M_string_length == 0) {
    poVar3 = std::operator<<(out,"0x");
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0x10;
    poVar3 = std::operator<<(poVar3,0x30);
    lVar1 = *(long *)poVar3;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  }
  else {
    *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0x20;
    poVar3 = std::operator<<(out,0x20);
    lVar1 = *(long *)poVar3;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffff4f | 0x20;
    poVar3 = std::operator<<(poVar3,(string *)str);
  }
  std::operator<<(poVar3," ");
  std::endl<char,std::char_traits<char>>(out);
  return;
}

Assistant:

static void dynamic_tag( std::ostream&      out,
                             Elf_Xword          no,
                             Elf_Xword          tag,
                             Elf_Xword          value,
                             const std::string& str,
                             unsigned int /*elf_class*/ )
    {
        out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
            << DUMP_STR_FORMAT( 16 ) << str_dynamic_tag( tag ) << " ";
        if ( str.empty() ) {
            out << DUMP_HEX0x_FORMAT( 16 ) << value << " ";
        }
        else {
            out << DUMP_STR_FORMAT( 32 ) << str << " ";
        }
        out << std::endl;
    }